

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

char * __thiscall cmMakefile::GetProperty(cmMakefile *this,string *prop,bool chain)

{
  cmLocalGenerator *pcVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  pointer pcVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *r;
  undefined1 local_68 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  do {
    if (GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_ == '\0') {
      GetProperty();
    }
    std::__cxx11::string::_M_replace
              (0x5b4250,0,
               (char *)GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_.
                       _M_string_length,0x4f559d);
    iVar6 = std::__cxx11::string::compare((char *)prop);
    if (iVar6 == 0) {
      cmState::Snapshot::GetBuildsystemDirectoryParent((Snapshot *)local_68,&this->StateSnapshot);
      bVar5 = cmState::Snapshot::IsValid((Snapshot *)local_68);
      if (!bVar5) {
        return "";
      }
      pcVar7 = cmState::Snapshot::GetCurrentSourceDirectory((Snapshot *)local_68);
      return pcVar7;
    }
    iVar6 = std::__cxx11::string::compare((char *)prop);
    sVar4 = GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_string_length;
    if (iVar6 == 0) {
      pcVar7 = (this->IncludeFileRegularExpression)._M_dataplus._M_p;
      strlen(pcVar7);
      std::__cxx11::string::_M_replace(0x5b4250,0,(char *)sVar4,(ulong)pcVar7);
      return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p;
    }
    iVar6 = std::__cxx11::string::compare((char *)prop);
    if (iVar6 == 0) {
      r = &this->ListFileStack;
LAB_0026be93:
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)local_68,r,";");
      std::__cxx11::string::operator=
                ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                 (string *)local_68);
      if ((cmState *)local_68._0_8_ == (cmState *)(local_68 + 0x10)) {
        return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p;
      }
      operator_delete((void *)local_68._0_8_,CONCAT71(local_68._17_7_,local_68[0x10]) + 1);
      return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p;
    }
    iVar6 = std::__cxx11::string::compare((char *)prop);
    if (iVar6 == 0) {
      cmState::GetCacheEntryKeys_abi_cxx11_
                (&local_48,this->LocalGenerator->GlobalGenerator->CMakeInstance->State);
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)local_68,&local_48,";");
LAB_0026be43:
      std::__cxx11::string::operator=
                ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                 (string *)local_68);
      if ((cmState *)local_68._0_8_ != (cmState *)(local_68 + 0x10)) {
        operator_delete((void *)local_68._0_8_,CONCAT71(local_68._17_7_,local_68[0x10]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p;
    }
    iVar6 = std::__cxx11::string::compare((char *)prop);
    if (iVar6 == 0) {
      GetDefinitions_abi_cxx11_(&local_48,this);
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)local_68,&local_48,";");
      goto LAB_0026be43;
    }
    iVar6 = std::__cxx11::string::compare((char *)prop);
    if (iVar6 == 0) {
      GetListOfMacros(this,&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
      return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p;
    }
    iVar6 = std::__cxx11::string::compare((char *)prop);
    if (iVar6 == 0) {
      r = &this->LinkDirectories;
      goto LAB_0026be93;
    }
    iVar6 = std::__cxx11::string::compare((char *)prop);
    if (iVar6 == 0) {
      local_68._0_8_ = local_68 + 0x10;
      local_68._8_8_ = (cmLinkedTree<cmState::SnapshotDataType> *)0x0;
      local_68[0x10] = '\0';
      pcVar2 = (this->IncludeDirectoriesEntries).
               super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pcVar8 = (this->IncludeDirectoriesEntries).
                    super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>.
                    _M_impl.super__Vector_impl_data._M_start; pcVar8 != pcVar2; pcVar8 = pcVar8 + 1)
      {
        std::__cxx11::string::_M_append
                  ((char *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                   local_68._0_8_);
        std::__cxx11::string::_M_append
                  ((char *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                   (ulong)(pcVar8->Value)._M_dataplus._M_p);
        std::__cxx11::string::_M_replace((ulong)local_68,0,(char *)local_68._8_8_,0x4ade95);
      }
LAB_0026c066:
      _Var3._M_p = GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p
      ;
      if ((cmState *)local_68._0_8_ != (cmState *)(local_68 + 0x10)) {
        operator_delete((void *)local_68._0_8_,CONCAT71(local_68._17_7_,local_68[0x10]) + 1);
      }
      return _Var3._M_p;
    }
    iVar6 = std::__cxx11::string::compare((char *)prop);
    if (iVar6 == 0) {
      local_68._0_8_ = local_68 + 0x10;
      local_68._8_8_ = (cmLinkedTree<cmState::SnapshotDataType> *)0x0;
      local_68[0x10] = '\0';
      pcVar2 = (this->CompileOptionsEntries).
               super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pcVar8 = (this->CompileOptionsEntries).
                    super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>.
                    _M_impl.super__Vector_impl_data._M_start; pcVar8 != pcVar2; pcVar8 = pcVar8 + 1)
      {
        std::__cxx11::string::_M_append
                  ((char *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                   local_68._0_8_);
        std::__cxx11::string::_M_append
                  ((char *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                   (ulong)(pcVar8->Value)._M_dataplus._M_p);
        std::__cxx11::string::_M_replace((ulong)local_68,0,(char *)local_68._8_8_,0x4ade95);
      }
      goto LAB_0026c066;
    }
    iVar6 = std::__cxx11::string::compare((char *)prop);
    if (iVar6 == 0) {
      local_68._0_8_ = local_68 + 0x10;
      local_68._8_8_ = (cmLinkedTree<cmState::SnapshotDataType> *)0x0;
      local_68[0x10] = '\0';
      pcVar2 = (this->CompileDefinitionsEntries).
               super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pcVar8 = (this->CompileDefinitionsEntries).
                    super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>.
                    _M_impl.super__Vector_impl_data._M_start; pcVar8 != pcVar2; pcVar8 = pcVar8 + 1)
      {
        std::__cxx11::string::_M_append
                  ((char *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                   local_68._0_8_);
        std::__cxx11::string::_M_append
                  ((char *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                   (ulong)(pcVar8->Value)._M_dataplus._M_p);
        std::__cxx11::string::_M_replace((ulong)local_68,0,(char *)local_68._8_8_,0x4ade95);
      }
      goto LAB_0026c066;
    }
    pcVar7 = cmPropertyMap::GetPropertyValue(&this->Properties,prop);
    if ((~chain & 1U) != 0 || pcVar7 != (char *)0x0) {
      return pcVar7;
    }
    pcVar1 = this->LocalGenerator->Parent;
    if (pcVar1 == (cmLocalGenerator *)0x0) {
      pcVar7 = cmState::GetGlobalProperty
                         (this->LocalGenerator->GlobalGenerator->CMakeInstance->State,prop);
      return pcVar7;
    }
    this = pcVar1->Makefile;
    chain = true;
  } while( true );
}

Assistant:

const char *cmMakefile::GetProperty(const std::string& prop,
                                    bool chain) const
{
  // watch for specific properties
  static std::string output;
  output = "";
  if (prop == "PARENT_DIRECTORY")
    {
    cmState::Snapshot parent =
        this->StateSnapshot.GetBuildsystemDirectoryParent();
    if(parent.IsValid())
      {
      return parent.GetCurrentSourceDirectory();
      }
    return "";
    }
  else if (prop == "INCLUDE_REGULAR_EXPRESSION" )
    {
    output = this->GetIncludeRegularExpression();
    return output.c_str();
    }
  else if (prop == "LISTFILE_STACK")
    {
    output = cmJoin(this->ListFileStack, ";");
    return output.c_str();
    }
  else if ( prop == "CACHE_VARIABLES" )
    {
    output = cmJoin(this->GetState()->GetCacheEntryKeys(), ";");
    return output.c_str();
    }
  else if (prop == "VARIABLES")
    {
    output = cmJoin(this->GetDefinitions(), ";");
    return output.c_str();
    }
  else if (prop == "MACROS")
    {
    this->GetListOfMacros(output);
    return output.c_str();
    }
  else if (prop == "LINK_DIRECTORIES")
    {
    output = cmJoin(this->GetLinkDirectories(), ";");
    return output.c_str();
    }
  else if (prop == "INCLUDE_DIRECTORIES")
    {
    std::string sep;
    for (std::vector<cmValueWithOrigin>::const_iterator
        it = this->IncludeDirectoriesEntries.begin(),
        end = this->IncludeDirectoriesEntries.end();
        it != end; ++it)
      {
      output += sep;
      output += it->Value;
      sep = ";";
      }
    return output.c_str();
    }
  else if (prop == "COMPILE_OPTIONS")
    {
    std::string sep;
    for (std::vector<cmValueWithOrigin>::const_iterator
        it = this->CompileOptionsEntries.begin(),
        end = this->CompileOptionsEntries.end();
        it != end; ++it)
      {
      output += sep;
      output += it->Value;
      sep = ";";
      }
    return output.c_str();
    }
  else if (prop == "COMPILE_DEFINITIONS")
    {
    std::string sep;
    for (std::vector<cmValueWithOrigin>::const_iterator
        it = this->CompileDefinitionsEntries.begin(),
        end = this->CompileDefinitionsEntries.end();
        it != end; ++it)
      {
      output += sep;
      output += it->Value;
      sep = ";";
      }
    return output.c_str();
    }

  const char *retVal = this->Properties.GetPropertyValue(prop);
  if (!retVal && chain)
    {
    if(this->LocalGenerator->GetParent())
      {
      return this->LocalGenerator->GetParent()->GetMakefile()->
        GetProperty(prop, chain);
      }
    return this->GetState()->GetGlobalProperty(prop);
    }

  return retVal;
}